

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

MemoryFill * __thiscall
wasm::Builder::makeMemoryFill
          (Builder *this,Expression *dest,Expression *value,Expression *size,Name memory)

{
  MemoryFill *pMVar1;
  
  pMVar1 = MixedArena::alloc<wasm::MemoryFill>(&this->wasm->allocator);
  pMVar1->dest = dest;
  pMVar1->value = value;
  pMVar1->size = size;
  (pMVar1->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (pMVar1->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  wasm::MemoryFill::finalize();
  return pMVar1;
}

Assistant:

MemoryFill* makeMemoryFill(Expression* dest,
                             Expression* value,
                             Expression* size,
                             Name memory) {
    auto* ret = wasm.allocator.alloc<MemoryFill>();
    ret->dest = dest;
    ret->value = value;
    ret->size = size;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }